

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregator.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_ad097::MinKernel::aggregate
          (MinKernel *this,CaliperMetadataAccessInterface *db,EntryList *list)

{
  Config *pCVar1;
  Node *pNVar2;
  pointer pEVar3;
  Node *pNVar4;
  int iVar5;
  undefined4 extraout_var;
  Attribute AVar6;
  cali_id_t cVar7;
  cali_id_t cVar8;
  Entry *e;
  pointer pEVar9;
  Variant local_40;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_lock);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  pCVar1 = this->m_config;
  if ((pCVar1->m_target_attr).m_node == (Node *)0x0) {
    iVar5 = (*db->_vptr_CaliperMetadataAccessInterface[2])(db,&pCVar1->m_target_attr_name);
    (pCVar1->m_target_attr).m_node = (Node *)CONCAT44(extraout_var,iVar5);
  }
  pNVar2 = (pCVar1->m_target_attr).m_node;
  AVar6 = Config::get_min_attr(this->m_config,db);
  if (AVar6.m_node != (Node *)0x0) {
    pEVar9 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pEVar3 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pEVar9 != pEVar3) {
      do {
        pNVar4 = pEVar9->m_node;
        cVar7 = 0xffffffffffffffff;
        cVar8 = 0xffffffffffffffff;
        if ((pNVar4 != (Node *)0x0) && (cVar8 = pNVar4->m_attribute, cVar8 == 8)) {
          cVar8 = pNVar4->m_id;
        }
        if (pNVar2 != (Node *)0x0) {
          cVar7 = pNVar2->m_id;
        }
        if (cVar8 == cVar7) {
LAB_001975bb:
          local_40.m_v.type_and_size = (pEVar9->m_value).m_v.type_and_size;
          local_40.m_v.value = (pEVar9->m_value).m_v.value;
          cali::Variant::min(&this->m_min,&local_40);
        }
        else {
          if (pNVar4 == (Node *)0x0) {
            cVar8 = 0xffffffffffffffff;
          }
          else {
            cVar8 = pNVar4->m_attribute;
            if (cVar8 == 8) {
              cVar8 = pNVar4->m_id;
            }
          }
          if (cVar8 == (AVar6.m_node)->m_id) goto LAB_001975bb;
        }
        pEVar9 = pEVar9 + 1;
      } while (pEVar9 != pEVar3);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_lock);
  return;
}

Assistant:

virtual void aggregate(CaliperMetadataAccessInterface& db, const EntryList& list)
    {
        std::lock_guard<std::mutex> g(m_lock);

        Attribute target_attr = m_config->get_target_attr(db);
        Attribute min_attr    = m_config->get_min_attr(db);

        if (!min_attr)
            return;

        for (const Entry& e : list) {
            if (e.attribute() == target_attr.id() || e.attribute() == min_attr.id())
                m_min.min(e.value());
        }
    }